

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void cbPlayback<short>(void *userData,uint8_t *stream,int len)

{
  short sVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  if (*userData == '\0') {
    for (; 0 < len; len = len + -2) {
      stream[0] = '\0';
      stream[1] = '\0';
      stream = stream + 2;
    }
    return;
  }
  lVar4 = *(long *)((long)userData + 8);
  iVar3 = 0;
  lVar2 = (int)(0x400 / (long)*(int *)((long)userData + 4)) + lVar4;
  if (*(long *)((long)userData + 0x20) < lVar2) {
    lVar2 = *(long *)((long)userData + 0x20);
  }
  for (; lVar4 < lVar2; lVar4 = lVar4 + 1) {
    sVar1 = *(short *)(*(long *)((long)userData + 0x18) + lVar4 * 2);
    *(short *)(stream + (long)iVar3 * 2) = sVar1;
    if (*(int *)((long)userData + 4) == 2) {
      *(short *)(stream + (long)(iVar3 + 1) * 2) =
           (short)(int)((double)(int)sVar1 * 0.5 +
                       (double)(int)*(short *)(*(long *)((long)userData + 0x18) + 2 + lVar4 * 2) *
                       0.5);
      len = len + -4;
      iVar3 = iVar3 + 2;
    }
    else {
      len = len + -2;
      iVar3 = iVar3 + 1;
    }
  }
  for (; 0 < len; len = len + -2) {
    lVar2 = *(long *)((long)userData + 8);
    (stream + lVar4 * 2 + lVar2 * -2)[0] = '\0';
    (stream + lVar4 * 2 + lVar2 * -2)[1] = '\0';
    lVar4 = lVar4 + 1;
  }
  *(long *)((long)userData + 8) = lVar4;
  return;
}

Assistant:

void cbPlayback(void * userData, uint8_t * stream, int len) {
    TPlaybackDataT<TSample> * data = (TPlaybackDataT<TSample> *)(userData);
    if (data->playing == false) {
        int offset = 0;
        TSample a = 0;
        while (len > 0) {
            memcpy(stream + offset*sizeof(a), &a, sizeof(a));
            len -= sizeof(a);
            ++offset;
        }
        return;
    }
    auto end = std::min(data->idx + TPlaybackDataT<TSample>::kSamples/data->slowDown, data->waveform.n);
    auto idx = data->idx;
    auto sidx = 0;
    for (; idx < end; ++idx) {
        TSample a = data->waveform.samples[idx];
        memcpy(stream + (sidx)*sizeof(a), &a, sizeof(a));
        len -= sizeof(a);
        ++sidx;

        if (data->slowDown == 2) {
            TSample a2 = data->waveform.samples[idx + 1];
            a = 0.5*a + 0.5*a2;
            memcpy(stream + (sidx)*sizeof(a), &a, sizeof(a));
            len -= sizeof(a);
            ++sidx;
        }
    }
    while (len > 0) {
        TSample a = 0;
        memcpy(stream + (idx - data->idx)*sizeof(a), &a, sizeof(a));
        len -= sizeof(a);
        ++idx;
    }
    data->idx = idx;
}